

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O2

int __thiscall
MeCab::DictionaryRewriter::open(DictionaryRewriter *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  istream *piVar5;
  undefined8 uVar6;
  int iVar7;
  bool bVar8;
  die local_271;
  string line;
  ifstream ifs;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&ifs,__file,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                            );
    poVar4 = std::operator<<(poVar4,"(");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x88);
    poVar4 = std::operator<<(poVar4,") [");
    poVar4 = std::operator<<(poVar4,"ifs");
    poVar4 = std::operator<<(poVar4,"] ");
    poVar4 = std::operator<<(poVar4,"no such file or directory: ");
    std::operator<<(poVar4,__file);
    die::~die((die *)&line);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  bVar1 = true;
  iVar2 = 0;
  while (iVar7 = iVar2, bVar8 = bVar1,
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&ifs,(string *)&line),
        ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
    if (___oflag != (Iconv *)0x0) {
      Iconv::convert(___oflag,&line);
    }
    bVar1 = bVar8;
    iVar2 = iVar7;
    if ((line._M_string_length != 0) && (*line._M_dataplus._M_p != '#')) {
      bVar3 = std::operator==(&line,"[unigram rewrite]");
      bVar1 = false;
      iVar2 = 1;
      if (!bVar3) {
        bVar3 = std::operator==(&line,"[left rewrite]");
        bVar1 = false;
        iVar2 = 2;
        if (!bVar3) {
          bVar3 = std::operator==(&line,"[right rewrite]");
          bVar1 = false;
          iVar2 = 3;
          if (!bVar3) {
            if (bVar8) {
              poVar4 = std::operator<<((ostream *)&std::cerr,
                                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary_rewriter.cpp"
                                      );
              poVar4 = std::operator<<(poVar4,"(");
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x95);
              poVar4 = std::operator<<(poVar4,") [");
              poVar4 = std::operator<<(poVar4,"append_to != 0");
              poVar4 = std::operator<<(poVar4,"] ");
              std::operator<<(poVar4,"no sections found");
              die::~die(&local_271);
              bVar1 = true;
              iVar2 = 0;
            }
            else if (iVar7 == 1) {
              anon_unknown.dwarf_87756::append_rewrite_rule
                        (&this->unigram_rewrite_,line._M_dataplus._M_p);
              bVar1 = false;
              iVar2 = 1;
            }
            else {
              bVar1 = false;
              if (iVar7 == 2) {
                anon_unknown.dwarf_87756::append_rewrite_rule
                          (&this->left_rewrite_,line._M_dataplus._M_p);
                iVar2 = 2;
              }
              else {
                anon_unknown.dwarf_87756::append_rewrite_rule
                          (&this->right_rewrite_,line._M_dataplus._M_p);
                iVar2 = 3;
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&line);
  uVar6 = std::ifstream::~ifstream(&ifs);
  return (int)CONCAT71((int7)((ulong)uVar6 >> 8),1);
}

Assistant:

bool DictionaryRewriter::open(const char *filename,
                              Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;
  int append_to = 0;
  std::string line;
  while (std::getline(ifs, line)) {
    if (iconv) iconv->convert(&line);
    if (line.empty() || line[0] == '#') continue;
    if (line == "[unigram rewrite]") {
      append_to = 1;
    } else if (line == "[left rewrite]") {
      append_to = 2;
    } else if (line == "[right rewrite]") {
      append_to = 3;
    } else {
      CHECK_DIE(append_to != 0) << "no sections found";
      char *str = const_cast<char *>(line.c_str());
      switch (append_to) {
        case 1: append_rewrite_rule(&unigram_rewrite_, str); break;
        case 2: append_rewrite_rule(&left_rewrite_,    str); break;
        case 3: append_rewrite_rule(&right_rewrite_,   str); break;
      }
    }
  }
  return true;
}